

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  pointer ppcVar1;
  cmSourceFile *pcVar2;
  cmLocalGenerator *this_00;
  pointer ppcVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  pointer config;
  iterator __begin3;
  pointer ppcVar7;
  undefined4 uVar8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_00;
  pointer ppcVar9;
  iterator __end3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string thisConfigFiles;
  string firstConfigFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  ostringstream e;
  bool local_289;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_288;
  string *local_268;
  string local_260;
  undefined4 local_23c;
  char *local_238;
  long local_230;
  char local_228;
  undefined7 uStack_227;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  cmGeneratorTarget *local_1e0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *local_1d8;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = files;
  cmMakefile::GetConfigurations(&local_1c8,this->Makefile,&local_1f8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&local_1f8);
  }
  config = local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GetSourceFilesWithoutObjectLibraries
            (this,local_1d8,
             local_1f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_289 = config == local_1f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  if (!local_289) {
    local_1d0 = config;
    local_1e0 = this;
    do {
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      files_00 = &local_288;
      local_268 = config;
      GetSourceFilesWithoutObjectLibraries(this,files_00,config);
      ppcVar3 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar7 = (local_1d8->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppcVar1 = (local_1d8->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (undefined4)CONCAT71((int7)((ulong)files_00 >> 8),1);
      if ((long)local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start == (long)ppcVar1 - (long)ppcVar7) {
        if (local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar8 = 0;
        }
        else {
          ppcVar9 = ppcVar7;
          iVar4 = bcmp(local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,ppcVar7,
                       (long)local_288.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_288.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          uVar8 = (undefined4)CONCAT71((int7)((ulong)ppcVar9 >> 8),iVar4 != 0);
        }
      }
      if ((char)uVar8 == '\0') {
        this = local_1e0;
        if (ppcVar3 != (pointer)0x0) {
          operator_delete(ppcVar3,(long)local_288.
                                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppcVar3);
          this = local_1e0;
        }
      }
      else {
        local_218 = &local_208;
        local_210 = 0;
        local_208 = '\0';
        local_23c = uVar8;
        ppcVar3 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (; local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish = ppcVar3, ppcVar7 != ppcVar1;
            ppcVar7 = ppcVar7 + 1) {
          pcVar2 = *ppcVar7;
          std::__cxx11::string::append((char *)&local_218);
          psVar5 = cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
          std::__cxx11::string::_M_append((char *)&local_218,(ulong)(psVar5->_M_dataplus)._M_p);
          ppcVar3 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        local_238 = &local_228;
        local_230 = 0;
        local_228 = '\0';
        for (ppcVar7 = local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar3;
            ppcVar7 = ppcVar7 + 1) {
          pcVar2 = *ppcVar7;
          std::__cxx11::string::append((char *)&local_238);
          psVar5 = cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
          std::__cxx11::string::_M_append((char *)&local_238,(ulong)(psVar5->_M_dataplus)._M_p);
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        this = local_1e0;
        psVar5 = cmTarget::GetName_abi_cxx11_(local_1e0->Target);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\" has source files which vary by configuration. This is not supported by the \""
                   ,0x4e);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_260);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" generator.\nConfig \"",0x15);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\n  ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_218,local_210);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConfig \"",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\n  ",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_238,local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        this_00 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_238 != &local_228) {
          operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
        }
        if (local_288.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_288.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((char)local_23c != '\0') break;
      }
      config = local_268 + 1;
      local_289 = config == local_1f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_289);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return local_289;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.emplace_back();
  }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}